

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedFallback
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  long *plVar1;
  SerialArena *this_00;
  void *pvVar2;
  long *in_FS_OFFSET;
  
  if ((*(ulong *)(this + 8) & 2) == 0) {
    pvVar2 = (void *)*in_FS_OFFSET;
  }
  else {
    plVar1 = *(long **)((*(ulong *)(this + 8) & 0xfffffffffffffff8) + 0x20);
    (**(code **)(*plVar1 + 0x10))(plVar1,type,n);
    pvVar2 = (void *)*in_FS_OFFSET;
    if (*(long *)((long)pvVar2 + 8) == *(long *)this) {
      this_00 = *(SerialArena **)((long)pvVar2 + 0x10);
      goto LAB_00313fc5;
    }
    this_00 = *(SerialArena **)(this + 0x18);
    if ((this_00 != (SerialArena *)0x0) && (this_00->owner_ == pvVar2)) goto LAB_00313fc5;
  }
  this_00 = GetSerialArenaFallback(this,pvVar2);
LAB_00313fc5:
  pvVar2 = SerialArena::AllocateAligned
                     (this_00,n,(AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8));
  return pvVar2;
}

Assistant:

PROTOBUF_NOINLINE
void* ThreadSafeArena::AllocateAlignedFallback(size_t n,
                                               const std::type_info* type) {
  if (alloc_policy_.should_record_allocs()) {
    alloc_policy_.RecordAlloc(type, n);
    SerialArena* arena;
    if (PROTOBUF_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
      return arena->AllocateAligned(n, alloc_policy_.get());
    }
  }
  return GetSerialArenaFallback(&thread_cache())
      ->AllocateAligned(n, alloc_policy_.get());
}